

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O1

Function * __thiscall camp::Class::function(Class *this,size_t index)

{
  OutOfRange *__return_storage_ptr__;
  string local_b0;
  string local_90;
  OutOfRange local_70;
  
  if (index < (this->m_functions).node_count) {
    return (Function *)(this->m_functions).super_type.ptrs.spc.data_[index][-5].up_;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange(&local_70,index,(this->m_functions).node_count);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"const Function &camp::Class::function(std::size_t) const","");
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_70,&local_90,0x50,&local_b0);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Function& Class::function(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_functions.size())
        CAMP_ERROR(OutOfRange(index, m_functions.size()));

    return *m_functions[index];
}